

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

float Gia_IffObjTimeOne(Iff_Man_t *p,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  float fVar4;
  float local_34;
  
  local_34 = -1e+09;
  for (lVar3 = 0; iVar1 = Gia_ObjLutSize(p->pGia,iObj), lVar3 < iVar1; lVar3 = lVar3 + 1) {
    piVar2 = Gia_ObjLutFanins(p->pGia,iObj);
    iVar1 = piVar2[lVar3];
    if ((iVar1 != iFaninSkip3 && iVar1 != iFaninSkip2) &&
       (fVar4 = Iff_ObjTimeId(p,iVar1), local_34 < fVar4)) {
      local_34 = Iff_ObjTimeId(p,iVar1);
    }
  }
  iVar1 = Gia_ObjLutSize(p->pGia,iObj);
  if (iVar1 != (int)lVar3) {
    __assert_fail("i == Gia_ObjLutSize(p->pGia, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIff.c"
                  ,0x97,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
  }
  if (iFaninSkip2 != -1) {
    for (lVar3 = 0; iVar1 = Gia_ObjLutSize(p->pGia,iFaninSkip2), lVar3 < iVar1; lVar3 = lVar3 + 1) {
      piVar2 = Gia_ObjLutFanins(p->pGia,iFaninSkip2);
      iVar1 = piVar2[lVar3];
      if ((iVar1 != iFaninSkip3) && (fVar4 = Iff_ObjTimeId(p,iVar1), local_34 < fVar4)) {
        local_34 = Iff_ObjTimeId(p,iVar1);
      }
    }
    if (iFaninSkip3 != -1) {
      for (lVar3 = 0; iVar1 = Gia_ObjLutSize(p->pGia,iFaninSkip3), lVar3 < iVar1; lVar3 = lVar3 + 1)
      {
        piVar2 = Gia_ObjLutFanins(p->pGia,iFaninSkip3);
        iVar1 = piVar2[lVar3];
        if ((iVar1 != iFaninSkip2) && (fVar4 = Iff_ObjTimeId(p,iVar1), local_34 < fVar4)) {
          local_34 = Iff_ObjTimeId(p,iVar1);
        }
      }
      if (local_34 < 0.0) {
        __assert_fail("DelayMax >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIff.c"
                      ,0xa2,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
      }
    }
  }
  return local_34;
}

Assistant:

float Gia_IffObjTimeOne( Iff_Man_t * p, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin;
    float DelayMax = -ABC_INFINITY;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
        if ( iFanin != iFaninSkip2 && iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( i == Gia_ObjLutSize(p->pGia, iObj) );
    if ( iFaninSkip2 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip2, iFanin, i )
        if ( iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    if ( iFaninSkip3 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip3, iFanin, i )
        if ( iFanin != iFaninSkip2 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( DelayMax >= 0 );
    return DelayMax;
}